

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O0

void test_ibuf_shrink(void)

{
  slab_cache *psVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  char *prev_buf;
  size_t start_capacity;
  ibuf ibuf;
  
  plan(0xc);
  _space(_stdout);
  printf("# *** %s ***\n","test_ibuf_shrink");
  ibuf_create((ibuf *)&start_capacity,&cache,0x4000);
  pvVar2 = ibuf_alloc((ibuf *)&start_capacity,0x19000);
  _ok((uint)(pvVar2 != (void *)0x0),"ibuf_alloc(&ibuf, 100 * 1024) != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x2e,
      "line %d");
  ibuf_consume((ibuf *)&start_capacity,0x11800);
  ibuf_shrink((ibuf *)&start_capacity);
  sVar3 = ibuf_used((ibuf *)&start_capacity);
  _ok((uint)(sVar3 == 0x7800),"ibuf_used(&ibuf) == (100 - 70) * 1024",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x34,
      "line %d");
  sVar3 = ibuf_capacity((ibuf *)&start_capacity);
  sVar4 = ibuf_used((ibuf *)&start_capacity);
  _ok((uint)(sVar4 <= sVar3),"ibuf_capacity(&ibuf) >= ibuf_used(&ibuf)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x35,
      "line %d");
  sVar3 = ibuf_capacity((ibuf *)&start_capacity);
  _ok((uint)(sVar3 < 0x10000),"ibuf_capacity(&ibuf) < start_capacity * 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x36,
      "line %d");
  psVar1 = ibuf.slabc;
  ibuf.buf = ibuf.buf + 1;
  ibuf_shrink((ibuf *)&start_capacity);
  _ok((uint)(psVar1 == ibuf.slabc),"prev_buf == ibuf.buf",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x3e,
      "line %d");
  sVar3 = ibuf_used((ibuf *)&start_capacity);
  ibuf_consume((ibuf *)&start_capacity,sVar3 - 1);
  ibuf_shrink((ibuf *)&start_capacity);
  sVar3 = ibuf_capacity((ibuf *)&start_capacity);
  _ok((uint)(0x3fff < sVar3),"ibuf_capacity(&ibuf) >= start_capacity",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x44,
      "line %d");
  sVar3 = ibuf_capacity((ibuf *)&start_capacity);
  _ok((uint)(sVar3 < 0x8000),"ibuf_capacity(&ibuf) < start_capacity * 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x45,
      "line %d");
  sVar3 = ibuf_used((ibuf *)&start_capacity);
  ibuf_consume((ibuf *)&start_capacity,sVar3);
  ibuf_shrink((ibuf *)&start_capacity);
  sVar3 = ibuf_capacity((ibuf *)&start_capacity);
  _ok((uint)(sVar3 == 0),"ibuf_capacity(&ibuf) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x4b,
      "line %d");
  pvVar2 = ibuf_alloc((ibuf *)&start_capacity,0x900000);
  _ok((uint)(pvVar2 != (void *)0x0),"ibuf_alloc(&ibuf, 9 * 1024 * 1024) != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x50,
      "line %d");
  sVar3 = ibuf_capacity((ibuf *)&start_capacity);
  _ok((uint)(sVar3 == 0x1000000),"ibuf_capacity(&ibuf) == 16 * 1024 * 1024",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x51,
      "line %d");
  ibuf_consume((ibuf *)&start_capacity,0x200000);
  ibuf_shrink((ibuf *)&start_capacity);
  sVar3 = ibuf_capacity((ibuf *)&start_capacity);
  _ok((uint)(sVar3 == 0x700000),"ibuf_capacity(&ibuf) == 7 * 1024 * 1024",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x54,
      "line %d");
  psVar1 = ibuf.slabc;
  ibuf_shrink((ibuf *)&start_capacity);
  _ok((uint)(psVar1 == ibuf.slabc),"prev_buf == ibuf.buf",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x5b,
      "line %d");
  ibuf_destroy((ibuf *)&start_capacity);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_ibuf_shrink");
  check_plan();
  return;
}

Assistant:

static void
test_ibuf_shrink(void)
{
	plan(12);
	header();

	struct ibuf ibuf;
	const size_t start_capacity = 16 * 1024;
	ibuf_create(&ibuf, &cache, start_capacity);
	ok(ibuf_alloc(&ibuf, 100 * 1024) != NULL);
	/*
	 * Check that ibuf is not shrunk lower than ibuf_used().
	 */
	ibuf_consume(&ibuf, 70 * 1024);
	ibuf_shrink(&ibuf);
	ok(ibuf_used(&ibuf) == (100 - 70) * 1024);
	ok(ibuf_capacity(&ibuf) >= ibuf_used(&ibuf));
	ok(ibuf_capacity(&ibuf) < start_capacity * 4);
	/*
	 * Check that there is no relocation if the actual size of the new slab
	 * equals the old slab size.
	 */
	ibuf.rpos++;
	char *prev_buf = ibuf.buf;
	ibuf_shrink(&ibuf);
	ok(prev_buf == ibuf.buf);
	/*
	 * Check that ibuf is not shrunk lower than start_capacity.
	 */
	ibuf_consume(&ibuf, ibuf_used(&ibuf) - 1);
	ibuf_shrink(&ibuf);
	ok(ibuf_capacity(&ibuf) >= start_capacity);
	ok(ibuf_capacity(&ibuf) < start_capacity * 2);
	/*
	 * Check that empty ibuf is shrunk to the zero capacity.
	 */
	ibuf_consume(&ibuf, ibuf_used(&ibuf));
	ibuf_shrink(&ibuf);
	ok(ibuf_capacity(&ibuf) == 0);
	/*
	 * Check that ibuf_shrink() does shrink large "unordered" slabs,
	 * i.e. allocated by slab_get_large().
	 */
	ok(ibuf_alloc(&ibuf, 9 * 1024 * 1024) != NULL);
	ok_no_asan(ibuf_capacity(&ibuf) == 16 * 1024 * 1024);
	ibuf_consume(&ibuf, 2 * 1024 * 1024);
	ibuf_shrink(&ibuf);
	ok_no_asan(ibuf_capacity(&ibuf) == 7 * 1024 * 1024);
	/*
	 * Check that there is no relocation if the size of a large slab
	 * doesn't change.
	 */
	prev_buf = ibuf.buf;
	ibuf_shrink(&ibuf);
	ok(prev_buf == ibuf.buf);
	ibuf_destroy(&ibuf);

	footer();
	check_plan();
}